

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O2

int andyzip::brotli_decoder::log2_floor(int x)

{
  int result;
  
  result = 0;
  for (; x != 0; x = x >> 1) {
    result = result + 1;
  }
  return result;
}

Assistant:

static int log2_floor(int x) {
      int result = 0;
      while (x) {
        x >>= 1;
        ++result;
      }
      return result;
    }